

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void compile_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  ushort uVar1;
  compiler_common *common_00;
  then_trap_backtrack *ptVar2;
  jump_list **ppjVar3;
  backtrack_common *pbVar4;
  sljit_s32 sVar5;
  int iVar6;
  PCRE2_SPTR16 cc;
  backtrack_common *pbVar7;
  backtrack_common *pbVar8;
  sljit_jump *psVar9;
  sljit_label *psVar10;
  sljit_u8 *psVar11;
  sljit_jump *psVar12;
  sljit_label *psVar13;
  jump_list *pjVar14;
  sljit_compiler *psVar15;
  sljit_u32 *in_R8;
  long srcw;
  int iVar16;
  uint uVar17;
  undefined6 uStack_108;
  PCRE2_UCHAR16 type;
  sljit_compiler *local_100;
  compiler_common *local_f8;
  PCRE2_UCHAR16 opcode;
  then_trap_backtrack **local_e8;
  sljit_s32 *local_e0;
  sljit_label **local_d8;
  sljit_u32 max;
  jump_list **local_c8;
  jump_list **local_c0;
  jump_list **local_b8;
  sljit_s32 *local_b0;
  jump_list *jumplist;
  jump_list *pjStack_a0;
  backtrack_common *local_98;
  jump_list *pjStack_90;
  compiler_common *local_88;
  jump_list *pjStack_80;
  undefined8 local_78;
  backtrack_common *local_70;
  jump_list **local_60;
  sljit_s32 *local_58;
  long local_50;
  then_trap_backtrack *local_48;
  sljit_u32 exact;
  sljit_u32 local_38 [2];
  
  local_48 = common->then_trap;
  local_e8 = &common->then_trap;
  if (current != (backtrack_common *)0x0) {
    local_100 = common->compiler;
    local_c0 = &common->revertframes;
    local_58 = &local_100->mode32;
    local_d8 = &common->quit_label;
    local_b8 = &common->quit;
    local_60 = &common->positive_assertion_quit;
    local_c8 = &common->reset_match;
    local_e0 = &common->ovector_start;
    local_b0 = &common->capture_last_ptr;
    local_f8 = common;
    do {
      if (current->nextbacktracks != (jump_list *)0x0) {
        compile_backtrackingpath_cold_1();
      }
      common_00 = (compiler_common *)current->cc;
      uVar1 = *(ushort *)&common_00->compiler;
      uVar17 = (uint)uVar1;
      switch(uVar1) {
      case 3:
        compile_backtrackingpath_cold_32();
        break;
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x6e:
      case 0x6f:
      case 0x70:
        psVar15 = common->compiler;
        max = 0;
        jumplist = (jump_list *)0x0;
        iVar6 = *(int *)((long)common->private_data_ptrs +
                        ((long)common_00 - (long)common->start) * 2);
        srcw = (long)iVar6;
        in_R8 = &exact;
        cc = get_iterator_parameters
                       (common_00,&opcode,&type,(PCRE2_UCHAR16 *)&max,in_R8,local_38,
                        (PCRE2_SPTR16 *)CONCAT26(type,uStack_108));
        if (opcode - 0x21 < 8) {
          uVar17 = (uint)(srcw != 0) * 2 + 0x8c;
          iVar16 = (int)(srcw + 8);
          switch((uint)opcode) {
          default:
            if ((type == 0x16) || (type == 0x11)) {
              compile_backtrackingpath_cold_29();
            }
            else {
              if (*(int *)&current[1].top == 0) {
                sljit_emit_op1(psVar15,0x20,2,0,uVar17,srcw);
                psVar12 = sljit_emit_cmp(psVar15,5,2,0,uVar17,(long)iVar16);
                sljit_emit_op2(local_f8->compiler,0x62,2,0,2,0,0x40,2);
                in_R8 = (sljit_u32 *)0x2;
                sljit_emit_op1(psVar15,0x20,uVar17,srcw,2,0);
                pbVar7 = (backtrack_common *)sljit_emit_jump(psVar15,0x18);
                if (pbVar7 != (backtrack_common *)0x0) {
                  pbVar8 = current[1].prev;
                  pbVar4 = pbVar8;
joined_r0x00151413:
                  if (pbVar4 != (backtrack_common *)0x0) {
                    pbVar7->top = (backtrack_common *)
                                  (((ulong)pbVar7->top & 0xfffffffffffffffc) + 1);
                    ((anon_union_8_2_cb96b71c_for_u *)&pbVar7->topbacktracks)->target =
                         (sljit_uw)pbVar8;
                  }
                }
              }
              else {
                sljit_emit_op1(psVar15,0x20,2,0,uVar17,srcw);
                sljit_emit_op1(psVar15,0x20,4,0,uVar17,srcw + 8);
                sljit_emit_op2(psVar15,0x62,2,0,2,0,0x40,2);
                psVar12 = sljit_emit_cmp(psVar15,5,2,0,4,0);
                pbVar8 = (backtrack_common *)sljit_emit_label(psVar15);
                if (psVar15->error == 0) {
                  psVar15->mode32 = 0;
                  psVar11 = emit_x86_instruction(psVar15,2,1,0,0x82,-2);
                  if (psVar11 != (sljit_u8 *)0x0) {
                    psVar11[0] = '\x0f';
                    psVar11[1] = 0xb7;
                  }
                }
                sljit_emit_op1(psVar15,0x20,uVar17,srcw,2,0);
                uVar17 = *(uint *)&current[1].nextbacktracks;
                if (((ulong)uVar17 != 0) && (psVar15->error == 0)) {
                  psVar15->mode32 = 0;
                  emit_cum_binary(psVar15,0xd0b0908,1,0,1,0,0x40,(ulong)uVar17);
                }
                psVar9 = sljit_emit_cmp(psVar15,0,1,0,0x40,
                                        (ulong)*(ushort *)((long)&current[1].nextbacktracks + 4));
                if ((psVar9 != (sljit_jump *)0x0) &&
                   (pbVar7 = current[1].prev, pbVar7 != (backtrack_common *)0x0)) {
                  psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
                  (psVar9->u).target = (sljit_uw)pbVar7;
                }
                sljit_emit_op2(local_f8->compiler,0x62,2,0,2,0,0x40,2);
                in_R8 = (sljit_u32 *)0x4;
                pbVar7 = (backtrack_common *)sljit_emit_cmp(psVar15,4,2,0,4,0);
                pbVar4 = pbVar7;
                if (pbVar8 != (backtrack_common *)0x0) goto joined_r0x00151413;
              }
              psVar13 = sljit_emit_label(psVar15);
              if ((psVar12 != (sljit_jump *)0x0) && (psVar13 != (sljit_label *)0x0)) {
                psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
                (psVar12->u).label = psVar13;
              }
              if (iVar6 == 0) {
                compile_backtrackingpath_cold_30();
              }
            }
            break;
          case 0x22:
            sljit_emit_op1(psVar15,0x20,2,0,uVar17,srcw);
            compile_char1_matchingpath(local_f8,type,cc,&jumplist,1);
            in_R8 = (sljit_u32 *)0x2;
            sljit_emit_op1(psVar15,0x20,uVar17,srcw,2,0);
            psVar12 = sljit_emit_jump(psVar15,0x18);
            pjVar14 = jumplist;
            if ((psVar12 != (sljit_jump *)0x0) &&
               (pbVar8 = current[1].prev, pbVar8 != (backtrack_common *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).target = (sljit_uw)pbVar8;
            }
            sljit_emit_label(psVar15);
            if (pjVar14 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_27();
            }
            if (iVar6 == 0) {
              compile_backtrackingpath_cold_28();
            }
            break;
          case 0x23:
          case 0x24:
            break;
          case 0x25:
            sljit_emit_op1(psVar15,0x20,2,0,uVar17,srcw);
            if (psVar15->error == 0) {
              psVar15->mode32 = 0;
              emit_mov(psVar15,uVar17,srcw,0x40,0);
            }
            psVar12 = sljit_emit_cmp(psVar15,1,2,0,0x40,0);
            if ((psVar12 != (sljit_jump *)0x0) &&
               (pbVar8 = current[1].prev, pbVar8 != (backtrack_common *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).target = (sljit_uw)pbVar8;
            }
            psVar12 = sljit_emit_jump(psVar15,0x18);
            pjVar14 = current[1].nextbacktracks;
            sljit_emit_label(psVar15);
            if (pjVar14 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_23();
            }
            in_R8 = (sljit_u32 *)(ulong)uVar17;
            sljit_emit_op1(psVar15,0x20,2,0,uVar17,srcw);
            if (psVar15->error == 0) {
              psVar15->mode32 = 0;
              in_R8 = (sljit_u32 *)0x0;
              emit_mov(psVar15,uVar17,srcw,0x40,0);
            }
            psVar9 = sljit_emit_jump(psVar15,0x18);
            if ((psVar9 != (sljit_jump *)0x0) &&
               (pbVar8 = current[1].prev, pbVar8 != (backtrack_common *)0x0)) {
              psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
              (psVar9->u).target = (sljit_uw)pbVar8;
            }
            psVar13 = sljit_emit_label(psVar15);
            if ((psVar12 != (sljit_jump *)0x0) && (psVar13 != (sljit_label *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).label = psVar13;
            }
            if (iVar6 == 0) {
              compile_backtrackingpath_cold_24();
            }
            break;
          case 0x26:
            sljit_emit_op1(psVar15,0x20,2,0,uVar17,srcw);
            if (psVar15->error == 0) {
              psVar15->mode32 = 0;
              emit_mov(psVar15,uVar17,srcw,0x40,0);
            }
            psVar12 = sljit_emit_cmp(psVar15,0,2,0,0x40,0);
            in_R8 = (sljit_u32 *)&DAT_00000001;
            compile_char1_matchingpath(local_f8,type,cc,&jumplist,1);
            psVar9 = sljit_emit_jump(psVar15,0x18);
            pjVar14 = jumplist;
            if ((psVar9 != (sljit_jump *)0x0) &&
               (pbVar8 = current[1].prev, pbVar8 != (backtrack_common *)0x0)) {
              psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
              (psVar9->u).target = (sljit_uw)pbVar8;
            }
            sljit_emit_label(psVar15);
            if (pjVar14 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_21();
            }
            psVar13 = sljit_emit_label(psVar15);
            if ((psVar12 != (sljit_jump *)0x0) && (psVar13 != (sljit_label *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).label = psVar13;
            }
            if (iVar6 == 0) {
              compile_backtrackingpath_cold_22();
            }
            break;
          case 0x28:
            local_50 = (long)iVar16;
            sljit_emit_op1(psVar15,0x20,1,0,uVar17,local_50);
            sljit_emit_op1(psVar15,0x20,2,0,uVar17,srcw);
            if (psVar15->error == 0) {
              psVar15->mode32 = 0;
              psVar11 = emit_x86_instruction(psVar15,0x11,0x40,1,1,0);
              if (psVar11 != (sljit_u8 *)0x0) {
                psVar11[1] = psVar11[1] | 0x28;
              }
            }
            psVar12 = sljit_emit_jump(psVar15,0);
            if ((psVar15->error == 0) &&
               (pjVar14 = (jump_list *)ensure_abuf(psVar15,0x10), pjVar14 != (jump_list *)0x0)) {
              pjVar14->next = jumplist;
              pjVar14->jump = psVar12;
              jumplist = pjVar14;
            }
            sljit_emit_op1(psVar15,0x20,uVar17,local_50,1,0);
            compile_char1_matchingpath(local_f8,type,cc,&jumplist,1);
            in_R8 = (sljit_u32 *)0x2;
            sljit_emit_op1(psVar15,0x20,uVar17,srcw,2,0);
            psVar12 = sljit_emit_jump(psVar15,0x18);
            pjVar14 = jumplist;
            if ((psVar12 != (sljit_jump *)0x0) &&
               (pbVar8 = current[1].prev, pbVar8 != (backtrack_common *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).target = (sljit_uw)pbVar8;
            }
            sljit_emit_label(psVar15);
            if (pjVar14 != (jump_list *)0x0) {
              compile_backtrackingpath_cold_25();
            }
            if (iVar6 == 0) {
              compile_backtrackingpath_cold_26();
            }
          }
        }
        pjVar14 = current->topbacktracks;
        sljit_emit_label(psVar15);
        common = local_f8;
        if (pjVar14 != (jump_list *)0x0) {
          compile_backtrackingpath_cold_31();
          common = local_f8;
        }
        break;
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
        if ((*(byte *)((long)&common_00->compiler + (ulong)(3 - ((ushort)(uVar1 - 0x71) < 2)) * 2) &
            1) == 0) {
          compile_backtrackingpath_cold_20();
        }
        else {
          compile_backtrackingpath_cold_19();
        }
        break;
      case 0x75:
        psVar15 = common->compiler;
        if (*(int *)&current[1].top == 0) {
          if (current[1].nextbacktracks[1].jump == (sljit_jump *)0x0) {
            compile_backtrackingpath_cold_17();
          }
          else {
            compile_backtrackingpath_cold_16();
          }
          in_R8 = (sljit_u32 *)0x40;
          psVar12 = sljit_emit_cmp(psVar15,1,1,0,0x40,0);
          if ((psVar12 != (sljit_jump *)0x0) &&
             (pbVar8 = current[1].prev, pbVar8 != (backtrack_common *)0x0)) {
            psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
            (psVar12->u).target = (sljit_uw)pbVar8;
          }
        }
        else {
          compile_backtrackingpath(common,current->top);
        }
        pjVar14 = current->topbacktracks;
        sljit_emit_label(psVar15);
        if (pjVar14 != (jump_list *)0x0) {
          compile_backtrackingpath_cold_18();
        }
        break;
      case 0x76:
      case 0x77:
      case 0x9f:
      case 0xa0:
      case 0xa1:
        compile_backtrackingpath_cold_4();
        break;
      case 0x82:
      case 0x83:
      case 0x85:
      case 0x87:
      case 0x88:
      case 0x8a:
      case 0x8c:
switchD_00150a65_caseD_82:
        pbVar8 = current;
LAB_00150fdd:
        compile_bracket_backtrackingpath(common,pbVar8);
        break;
      case 0x84:
      case 0x86:
      case 0x89:
      case 0x8b:
      case 0x95:
        psVar15 = common->compiler;
        if (*(int *)((long)&current[1].prev + 4) < 0) {
          if ((uVar1 == 0x8b) || (uVar1 == 0x86)) {
            sVar5 = psVar15->error;
            if (sVar5 == 0) {
              psVar15->mode32 = 0;
              psVar11 = emit_x86_instruction(psVar15,1,1,0,0x8c,0);
              if (psVar11 != (sljit_u8 *)0x0) {
                *psVar11 = 0x8b;
              }
              if (psVar15->error == 0) {
                compile_backtrackingpath_cold_12();
              }
              sVar5 = psVar15->error;
            }
            if (*local_b0 != 0) {
              if (sVar5 != 0) goto LAB_001511f2;
              psVar15->mode32 = 0;
              psVar11 = emit_x86_instruction(psVar15,1,1,0,0x8c,0x10);
              if (psVar11 == (sljit_u8 *)0x0) {
                sVar5 = psVar15->error;
              }
              else {
                *psVar11 = 0x8b;
                sVar5 = psVar15->error;
              }
            }
            if (sVar5 == 0) {
              compile_backtrackingpath_cold_13();
            }
            compile_backtrackingpath_cold_14();
          }
LAB_001511f2:
          pjVar14 = current->topbacktracks;
          sljit_emit_label(psVar15);
          if (pjVar14 != (jump_list *)0x0) {
            compile_backtrackingpath_cold_15();
          }
          in_R8 = (sljit_u32 *)0xc;
          sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,
                         (long)*(int *)&current[1].nextbacktracks << 3);
        }
        else {
          if (psVar15->error == 0) {
            iVar6 = *(int *)&current[1].prev;
            psVar15->mode32 = 0;
            psVar11 = emit_x86_instruction(psVar15,1,0xc,0,0x8e,(long)iVar6);
            if (psVar11 != (sljit_u8 *)0x0) {
              *psVar11 = 0x8b;
            }
          }
          psVar12 = sljit_emit_jump(psVar15,0x19);
          if ((psVar15->error == 0) &&
             (pjVar14 = (jump_list *)ensure_abuf(psVar15,0x10), pjVar14 != (jump_list *)0x0)) {
            pjVar14->next = *local_c0;
            pjVar14->jump = psVar12;
            *local_c0 = pjVar14;
          }
          in_R8 = (sljit_u32 *)0xc;
          sljit_emit_op2(psVar15,0x60,0xc,0,0xc,0,0x40,
                         (long)*(int *)((long)&current[1].prev + 4) * 8 + -8);
          if (current->topbacktracks != (jump_list *)0x0) {
            compile_backtrackingpath_cold_11();
          }
          if (psVar15->error == 0) {
            in_R8 = (sljit_u32 *)(long)(int)(~*(uint *)((long)&current[1].prev + 4) << 3);
            iVar6 = *(int *)&current[1].prev;
            psVar15->mode32 = 0;
            emit_mov(psVar15,0x8e,(long)iVar6,0x8c,(sljit_sw)in_R8);
          }
        }
        break;
      case 0x93:
        if (0x81 < *(ushort *)((long)&common_00->compiler + 2)) goto switchD_00150a65_caseD_82;
      case 0x7e:
      case 0x7f:
      case 0x80:
      case 0x81:
        compile_assert_backtrackingpath(common,current);
        break;
      case 0x94:
        current->nextbacktracks = (jump_list *)0x0;
        current->top = (backtrack_common *)0x0;
        current->topbacktracks = (jump_list *)0x0;
        if (0x81 < *(ushort *)((long)&common_00->compiler + 2)) {
          compile_bracket_matchingpath(common,(PCRE2_SPTR16)common_00,current);
          pbVar8 = current->top;
          goto LAB_00150fdd;
        }
        pjStack_80 = (jump_list *)0x0;
        local_98 = (backtrack_common *)0x0;
        pjStack_90 = (jump_list *)0x0;
        jumplist = (jump_list *)0x0;
        pjStack_a0 = (jump_list *)0x0;
        local_78._0_4_ = 0;
        local_78._4_4_ = 0;
        local_70 = current[1].prev;
        local_88 = common_00;
        compile_assert_matchingpath(common,(PCRE2_SPTR16)common_00,(assert_backtrack *)&jumplist,0);
        break;
      case 0x96:
        iVar6 = common->has_skip_arg;
        if (local_100->error == 0) {
          local_100->mode32 = 0;
          psVar11 = emit_x86_instruction(local_100,1,1,0,0x8c,(ulong)(iVar6 != 0) << 5);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x8b;
          }
          iVar6 = common->has_skip_arg;
        }
        if ((iVar6 != 0) && (local_100->error == 0)) {
          local_100->mode32 = 0;
          psVar11 = emit_x86_instruction(local_100,1,4,0,0x8c,0);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x8b;
          }
        }
        in_R8 = (sljit_u32 *)0xc;
        sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,
                       (ulong)(common->has_skip_arg != 0) << 5 | 8);
        if (local_100->error == 0) {
          iVar6 = common->mark_ptr;
          local_100->mode32 = 0;
          in_R8 = (sljit_u32 *)0x8e;
          psVar11 = emit_x86_instruction(local_100,1,1,0,0x8e,(long)iVar6);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x89;
          }
        }
        if ((common->has_skip_arg != 0) && (local_100->error == 0)) {
          iVar6 = common->control_head_ptr;
          local_100->mode32 = 0;
          sVar5 = 4;
          psVar15 = local_100;
LAB_00151c2b:
          in_R8 = (sljit_u32 *)0x8e;
          psVar11 = emit_x86_instruction(psVar15,1,sVar5,0,0x8e,(long)iVar6);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x89;
          }
        }
        break;
      case 0x97:
      case 0x98:
      case 0x99:
      case 0x9a:
      case 0x9b:
      case 0x9c:
        psVar15 = common->compiler;
        if ((ushort)(uVar1 - 0x9b) < 2) {
          if (*local_e8 == (then_trap_backtrack *)0x0) {
            if (common->local_quit_available != 0) goto LAB_001516ac;
            if (common->in_positive_assertion == 0) goto LAB_001514ab;
            compile_backtrackingpath_cold_7();
          }
          else {
            if (psVar15->error == 0) {
              iVar6 = common->control_head_ptr;
              psVar15->mode32 = 0;
              psVar11 = emit_x86_instruction(psVar15,1,0xc,0,0x8e,(long)iVar6);
              if (psVar11 != (sljit_u8 *)0x0) {
                *psVar11 = 0x8b;
              }
              if (psVar15->error == 0) {
                compile_backtrackingpath_cold_5();
              }
            }
            psVar12 = sljit_emit_jump(psVar15,0x18);
            psVar13 = sljit_emit_label(psVar15);
            if (psVar15->error == 0) {
              psVar15->mode32 = 0;
              psVar11 = emit_x86_instruction(psVar15,1,0xc,0,0x8c,0);
              if (psVar11 != (sljit_u8 *)0x0) {
                *psVar11 = 0x8b;
              }
            }
            psVar10 = sljit_emit_label(psVar15);
            if ((psVar12 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).label = psVar10;
            }
            psVar12 = sljit_emit_cmp(psVar15,1,0x8c,8,1,0);
            if ((psVar13 != (sljit_label *)0x0) && (psVar12 != (sljit_jump *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).label = psVar13;
            }
            in_R8 = (sljit_u32 *)0x4;
            psVar12 = sljit_emit_cmp(psVar15,1,0x8c,0x10,4,0);
            if ((psVar13 != (sljit_label *)0x0) && (psVar12 != (sljit_jump *)0x0)) {
              psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
              (psVar12->u).label = psVar13;
            }
            ptVar2 = *local_e8;
            psVar12 = sljit_emit_jump(psVar15,0x18);
            if ((psVar15->error == 0) &&
               (pjVar14 = (jump_list *)ensure_abuf(psVar15,0x10), pjVar14 != (jump_list *)0x0)) {
              pjVar14->next = ptVar2->quit;
              pjVar14->jump = psVar12;
              ptVar2->quit = pjVar14;
            }
          }
        }
        else if (common->local_quit_available == 0) {
LAB_001514ab:
          if (uVar1 == 0x99) {
            compile_backtrackingpath_cold_8();
          }
          else {
            if (uVar1 == 0x9a) {
              if (psVar15->error == 0) {
                iVar6 = common->control_head_ptr;
                psVar15->mode32 = 0;
                uVar17 = 0;
                in_R8 = (sljit_u32 *)0x8e;
                psVar11 = emit_x86_instruction(psVar15,1,1,0,0x8e,(long)iVar6);
                if (psVar11 != (sljit_u8 *)0x0) {
                  *psVar11 = 0x8b;
                }
                if (psVar15->error == 0) {
                  in_R8 = (sljit_u32 *)(current->cc + 2);
                  psVar15->mode32 = 0;
                  uVar17 = 0x40;
                  emit_mov(psVar15,2,0,0x40,(sljit_sw)in_R8);
                }
              }
              sljit_emit_icall(psVar15,0x111,0x155738,uVar17,(sljit_sw)in_R8);
              if (psVar15->error == 0) {
                psVar15->mode32 = 0;
                psVar11 = emit_x86_instruction(psVar15,1,1,0,2,0);
                if (psVar11 != (sljit_u8 *)0x0) {
                  *psVar11 = 0x89;
                }
              }
              in_R8 = (sljit_u32 *)0x40;
              psVar12 = sljit_emit_cmp(psVar15,1,1,0,0x40,0);
              if (psVar15->error == 0) {
                pjVar14 = (jump_list *)ensure_abuf(psVar15,0x10);
                ppjVar3 = local_c8;
                goto joined_r0x00151c6f;
              }
              break;
            }
            compile_backtrackingpath_cold_9();
          }
          compile_backtrackingpath_cold_10();
        }
        else {
LAB_001516ac:
          compile_backtrackingpath_cold_6();
        }
        break;
      case 0x9d:
      case 0x9e:
        if ((common->local_quit_available == 0) && (local_100->error == 0)) {
          local_100->mode32 = 0;
          in_R8 = (sljit_u32 *)0xffffffffffffffff;
          emit_mov(local_100,1,0,0x40,-1);
        }
        psVar15 = local_100;
        psVar13 = *local_d8;
        psVar12 = sljit_emit_jump(local_100,0x18);
        if (psVar13 == (sljit_label *)0x0) {
          if (psVar15->error == 0) {
            pjVar14 = (jump_list *)ensure_abuf(local_100,0x10);
            ppjVar3 = local_b8;
joined_r0x00151c6f:
            if (pjVar14 != (jump_list *)0x0) {
              pjVar14->next = *ppjVar3;
              pjVar14->jump = psVar12;
              *ppjVar3 = pjVar14;
            }
          }
        }
        else if ((psVar12 != (sljit_jump *)0x0) &&
                (psVar13 = *local_d8, psVar13 != (sljit_label *)0x0)) {
          psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
          (psVar12->u).target = (sljit_uw)psVar13;
        }
        break;
      case 0xa5:
        if ((then_trap_backtrack *)current[1].prev == (then_trap_backtrack *)0x0) {
          psVar15 = common->compiler;
          iVar6 = *(int *)&current[1].topbacktracks;
          if (*(int *)&current[1].topbacktracks < 1) {
            iVar6 = 0;
          }
          if (psVar15->error == 0) {
            psVar15->mode32 = 0;
            psVar11 = emit_x86_instruction(psVar15,1,1,0,0x8c,(ulong)(uint)(iVar6 * 8));
            if (psVar11 != (sljit_u8 *)0x0) {
              *psVar11 = 0x8b;
            }
          }
          sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,(ulong)(iVar6 + 3) << 3);
          psVar12 = sljit_emit_jump(psVar15,0x18);
          pbVar8 = current[1].top;
          sljit_emit_label(psVar15);
          if (pbVar8 != (backtrack_common *)0x0) {
            compile_backtrackingpath_cold_2();
          }
          if (-1 < *(int *)&current[1].topbacktracks) {
            compile_backtrackingpath_cold_3();
          }
          if (psVar15->error == 0) {
            psVar15->mode32 = 0;
            psVar11 = emit_x86_instruction(psVar15,1,1,0,0x8c,0);
            if (psVar11 != (sljit_u8 *)0x0) {
              *psVar11 = 0x8b;
            }
          }
          in_R8 = (sljit_u32 *)0xc;
          sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,0x18);
          psVar13 = sljit_emit_label(psVar15);
          if ((psVar12 != (sljit_jump *)0x0) && (psVar13 != (sljit_label *)0x0)) {
            psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
            (psVar12->u).label = psVar13;
          }
          if (psVar15->error == 0) {
            iVar6 = common->control_head_ptr;
            psVar15->mode32 = 0;
            sVar5 = 1;
            goto LAB_00151c2b;
          }
        }
        else {
          *local_e8 = (then_trap_backtrack *)current[1].prev;
        }
      }
      current = current->prev;
    } while (current != (backtrack_common *)0x0);
  }
  *local_e8 = local_48;
  return;
}

Assistant:

static void compile_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
then_trap_backtrack *save_then_trap = common->then_trap;

while (current)
  {
  if (current->nextbacktracks != NULL)
    set_jumps(current->nextbacktracks, LABEL());
  switch(*current->cc)
    {
    case OP_SET_SOM:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), TMP1, 0);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
#endif
    compile_iterator_backtrackingpath(common, current);
    break;

    case OP_REF:
    case OP_REFI:
    case OP_DNREF:
    case OP_DNREFI:
    compile_ref_iterator_backtrackingpath(common, current);
    break;

    case OP_RECURSE:
    compile_recurse_backtrackingpath(common, current);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    compile_assert_backtrackingpath(common, current);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    compile_bracket_backtrackingpath(common, current);
    break;

    case OP_BRAZERO:
    if (current->cc[1] > OP_ASSERTBACK_NOT)
      compile_bracket_backtrackingpath(common, current);
    else
      compile_assert_backtrackingpath(common, current);
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    compile_bracketpos_backtrackingpath(common, current);
    break;

    case OP_BRAMINZERO:
    compile_braminzero_backtrackingpath(common, current);
    break;

    case OP_MARK:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0));
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP1, 0);
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, TMP2, 0);
    break;

    case OP_THEN:
    case OP_THEN_ARG:
    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    compile_control_verb_backtrackingpath(common, current);
    break;

    case OP_COMMIT:
    case OP_COMMIT_ARG:
    if (!common->local_quit_available)
      OP1(SLJIT_MOV, SLJIT_RETURN_REG, 0, SLJIT_IMM, PCRE2_ERROR_NOMATCH);
    if (common->quit_label == NULL)
      add_jump(compiler, &common->quit, JUMP(SLJIT_JUMP));
    else
      JUMPTO(SLJIT_JUMP, common->quit_label);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    set_jumps(current->topbacktracks, LABEL());
    break;

    case OP_THEN_TRAP:
    /* A virtual opcode for then traps. */
    compile_then_trap_backtrackingpath(common, current);
    break;

    default:
    SLJIT_UNREACHABLE();
    break;
    }
  current = current->prev;
  }
common->then_trap = save_then_trap;
}